

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# dothrow.c
# Opt level: O0

int omon_adj(monst *mon,obj *obj,boolean mon_notices)

{
  uint uVar1;
  int iVar2;
  uint local_20;
  int tmp;
  boolean mon_notices_local;
  obj *obj_local;
  monst *mon_local;
  
  uVar1 = (uint)mon->data->msize;
  local_20 = uVar1 - 2;
  if (((*(uint *)&mon->field_0x60 >> 0x13 & 1) != 0) && (local_20 = uVar1, mon_notices != '\0')) {
    *(uint *)&mon->field_0x60 = *(uint *)&mon->field_0x60 & 0xfff7ffff;
  }
  if (((((*(uint *)&mon->field_0x60 >> 0x12 & 1) == 0) || (mon->data->mmove == '\0')) &&
      (local_20 = local_20 + 4, mon_notices != '\0')) &&
     ((mon->data->mmove != '\0' && (iVar2 = rn2(10), iVar2 == 0)))) {
    *(uint *)&mon->field_0x60 = *(uint *)&mon->field_0x60 & 0xfffbffff | 0x40000;
    mon->mfrozen = '\0';
  }
  if (obj->otyp == 0x214) {
    local_20 = local_20 + 6;
  }
  else if (obj->otyp == 0x216) {
    if (obj != uball) {
      local_20 = local_20 + 2;
    }
  }
  else if (((obj->oclass == '\x02') ||
           ((obj->oclass == '\x06' && (objects[obj->otyp].oc_subtyp != '\0')))) ||
          (obj->oclass == '\r')) {
    iVar2 = hitval(obj,mon);
    local_20 = iVar2 + local_20;
  }
  return local_20;
}

Assistant:

int omon_adj(struct monst *mon, struct obj *obj, boolean mon_notices)
{
	int tmp = 0;

	/* size of target affects the chance of hitting */
	tmp += (mon->data->msize - MZ_MEDIUM);		/* -2..+5 */
	/* sleeping target is more likely to be hit */
	if (mon->msleeping) {
	    tmp += 2;
	    if (mon_notices) mon->msleeping = 0;
	}
	/* ditto for immobilized target */
	if (!mon->mcanmove || !mon->data->mmove) {
	    tmp += 4;
	    if (mon_notices && mon->data->mmove && !rn2(10)) {
		mon->mcanmove = 1;
		mon->mfrozen = 0;
	    }
	}
	/* some objects are more likely to hit than others */
	switch (obj->otyp) {
	case HEAVY_IRON_BALL:
	    if (obj != uball) tmp += 2;
	    break;
	case BOULDER:
	    tmp += 6;
	    break;
	default:
	    if (obj->oclass == WEAPON_CLASS || is_weptool(obj) ||
		    obj->oclass == GEM_CLASS)
		tmp += hitval(obj, mon);
	    break;
	}
	return tmp;
}